

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::ComputeMulRange::operator()
          (ComputeMulRange *this,Random *rnd,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  bool bVar1;
  deUint32 dVar2;
  deBool dVar3;
  int i;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_48;
  
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  local_48 = (float)(dVar2 & 7) * 0.25 + 0.25;
  fVar5 = dstMax / local_48;
  fVar6 = ceilf((dstMin / local_48) * 8.0);
  fVar6 = fVar6 * 0.125;
  if (fVar6 <= fVar5) {
    fVar7 = floorf(fVar5 * 8.0);
    bVar1 = fVar6 <= fVar7 * 0.125;
    if (bVar1) {
      bVar1 = true;
      fVar5 = fVar7 * 0.125;
    }
  }
  else {
    bVar1 = false;
    fVar6 = dstMin / local_48;
  }
  if (!bVar1) {
    local_48 = 1.0;
    fVar5 = dstMax;
    fVar6 = dstMin;
  }
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  iVar4 = 0;
  fVar7 = (float)(int)(dVar2 % ((int)((fVar5 - fVar6) * 4.0) + 1U)) * 0.25 + 0.0;
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  fVar6 = (float)(int)(dVar2 % ((int)(((fVar5 - fVar6) - fVar7) * 4.0) + 1U)) * 0.25 + 0.0 + fVar6;
  *aMin = fVar6;
  *aMax = fVar6 + fVar7;
  *bMin = local_48;
  *bMax = local_48;
  do {
    fVar5 = (float)iVar4 * -0.25 + local_48;
    if ((((dstMin <= *aMin * fVar5) && (*aMin * fVar5 < dstMax)) && (dstMin <= *aMax * fVar5)) &&
       (*aMax * fVar5 < dstMax)) {
      *bMin = fVar5;
    }
    fVar5 = (float)iVar4 * 0.25 + local_48;
    if (((dstMin <= *aMin * fVar5) && (*aMin * fVar5 < dstMax)) &&
       ((dstMin <= *aMax * fVar5 && (*aMax * fVar5 < dstMax)))) {
      *bMax = fVar5;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 5);
  dVar3 = deRandom_getBool(&rnd->m_rnd);
  if (dVar3 == 1) {
    fVar5 = *aMin;
    *aMin = *aMax;
    *aMax = fVar5;
    fVar5 = *bMin;
    *bMin = *bMax;
    *bMax = fVar5;
    *aMin = -*aMin;
    *aMax = -*aMax;
    *bMin = -*bMin;
    *bMax = -*bMax;
  }
  return;
}

Assistant:

void ComputeMulRange::operator() (de::Random& rnd, float dstMin, float dstMax, float& aMin, float& aMax, float& bMin, float& bMax) const
{
	const float minScale	 = 0.25f;
	const float maxScale	 = 2.0f;
	const float subRangeStep = 0.25f;
	const float scaleStep	 = 0.25f;

	float scale		= getQuantizedFloat(rnd, minScale, maxScale, scaleStep);
	float scaledMin	= dstMin/scale;
	float scaledMax	= dstMax/scale;

	// Quantize scaled value range if possible
	if (!quantizeFloatRange(scaledMin, scaledMax))
	{
		// Fall back to 1.0 as a scale
		scale		= 1.0f;
		scaledMin	= dstMin;
		scaledMax	= dstMax;
	}

	float subRangeLen = getQuantizedFloat(rnd, 0.0f, scaledMax-scaledMin, subRangeStep);
	aMin = scaledMin + getQuantizedFloat(rnd, 0.0f, (scaledMax-scaledMin)-subRangeLen, subRangeStep);
	aMax = aMin + subRangeLen;

	// Find scale range
	bMin = scale;
	bMax = scale;
	for (int i = 0; i < 5; i++)
	{
		if (de::inBounds(aMin*(scale-(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale-(float)i*scaleStep), dstMin, dstMax))
			bMin = scale-(float)i*scaleStep;

		if (de::inBounds(aMin*(scale+(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale+(float)i*scaleStep), dstMin, dstMax))
			bMax = scale+(float)i*scaleStep;
	}

	// Negative scale?
	if (rnd.getBool())
	{
		std::swap(aMin, aMax);
		std::swap(bMin, bMax);
		aMin	*= -1.0f;
		aMax	*= -1.0f;
		bMin	*= -1.0f;
		bMax	*= -1.0f;
	}

#if defined(DE_DEBUG)
	const float eps = 0.001f;
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin*bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMax, dstMin-eps, dstMax+eps));
#endif
}